

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateByteSize
          (MessageGenerator *this,Printer *printer)

{
  Options *options;
  pointer *pppFVar1;
  pointer *ppvVar2;
  vector<int,_std::allocator<int>_> *has_bit_indices;
  AlphaNum *this_00;
  string *psVar3;
  pointer ppFVar4;
  cpp *this_01;
  FieldDescriptor *field;
  iterator __position;
  MessageGenerator *pMVar5;
  undefined1 auVar6 [8];
  bool bVar7;
  int iVar8;
  int iVar9;
  uint32 uVar10;
  FileOptions_OptimizeMode FVar11;
  FieldGeneratorMap *pFVar12;
  FieldGenerator *pFVar13;
  LogMessage *pLVar14;
  pointer ppFVar15;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvVar16;
  uint32 uVar17;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *pFVar18;
  FieldDescriptor *field_00;
  long lVar19;
  pointer puVar20;
  const_iterator __begin4;
  iterator __first;
  long *plVar21;
  long lVar22;
  char *format_00;
  Descriptor *descriptor;
  long lVar23;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_02;
  int *cached_has_word_index_00;
  stringpiece_ssize_type in_R9;
  size_type *psVar24;
  ulong uVar25;
  ulong uVar26;
  iterator __position_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Hex HVar27;
  StringPiece has_bits_var;
  undefined1 local_1d8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  Iterator __end4;
  Iterator __end3;
  undefined1 local_178 [8];
  ColdChunkSkipper cold_skipper;
  Iterator __begin4_1;
  undefined1 local_100 [8];
  string chunk_mask_str;
  vector<unsigned_int,_std::allocator<unsigned_int>_> masks_for_has_bits;
  undefined1 auStack_a8 [8];
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  chunks;
  Formatter format;
  int local_3c;
  MessageGenerator *pMStack_38;
  int cached_has_word_index;
  
  chunks.
  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&format,&(this->variables_)._M_t);
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x48) == '\x01') {
    cold_skipper.access_info_map_ = (AccessInfoMap *)&cold_skipper;
    cold_skipper.chunks_._0_4_ = 0;
    cold_skipper.has_bit_indices_ = (vector<int,_std::allocator<int>_> *)0x0;
    cold_skipper.variables_._M_t._M_impl._0_8_ = 0;
    cold_skipper.cold_threshold_ = (double)cold_skipper.access_info_map_;
    SetUnknkownFieldsVariable
              (this->descriptor_,&this->options_,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_178);
    Formatter::AddMap((Formatter *)
                      &chunks.
                       super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_178);
    Formatter::operator()<>
              ((Formatter *)
               &chunks.
                super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "size_t $classname$::ByteSizeLong() const {\n// @@protoc_insertion_point(message_set_byte_size_start:$full_name$)\n  size_t total_size = _extensions_.MessageSetByteSize();\n  if ($have_unknown_fields$) {\n    total_size += ::$proto_ns$::internal::\n        ComputeUnknownMessageSetItemsSize($unknown_fields$);\n  }\n  int cached_size = ::$proto_ns$::internal::ToCachedSize(total_size);\n  SetCachedSize(cached_size);\n  return total_size;\n}\n"
              );
    this_02 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_178;
    goto LAB_001e38a6;
  }
  pMStack_38 = this;
  if (1 < this->num_required_fields_) {
    Formatter::operator()<>
              ((Formatter *)
               &chunks.
                super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "size_t $classname$::RequiredFieldsByteSizeFallback() const {\n// @@protoc_insertion_point(required_fields_byte_size_fallback_start:$full_name$)\n"
              );
    google::protobuf::io::Printer::Indent();
    Formatter::operator()<>
              ((Formatter *)
               &chunks.
                super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"size_t total_size = 0;\n");
    ppFVar15 = (this->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar4 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar15 != ppFVar4) {
      pFVar12 = &pMStack_38->field_generators_;
      ppvVar2 = &chunks.
                 super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pFVar18 = extraout_RDX;
      do {
        this_01 = (cpp *)*ppFVar15;
        if (*(int *)(this_01 + 0x3c) == 2) {
          FieldName_abi_cxx11_((string *)local_178,this_01,pFVar18);
          Formatter::operator()
                    ((Formatter *)ppvVar2,"\nif (_internal_has_$1$()) {\n",(string *)local_178);
          if (local_178 != (undefined1  [8])&cold_skipper.has_bit_indices_) {
            operator_delete((void *)local_178);
          }
          google::protobuf::io::Printer::Indent();
          PrintFieldComment<google::protobuf::FieldDescriptor>
                    ((Formatter *)ppvVar2,(FieldDescriptor *)this_01);
          pFVar13 = FieldGeneratorMap::get(pFVar12,(FieldDescriptor *)this_01);
          (*pFVar13->_vptr_FieldGenerator[0x14])(pFVar13,printer);
          google::protobuf::io::Printer::Outdent();
          Formatter::operator()<>((Formatter *)ppvVar2,"}\n");
          pFVar18 = extraout_RDX_00;
        }
        ppFVar15 = ppFVar15 + 1;
      } while (ppFVar15 != ppFVar4);
    }
    Formatter::operator()<>
              ((Formatter *)
               &chunks.
                super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"\nreturn total_size;\n");
    this = pMStack_38;
    google::protobuf::io::Printer::Outdent();
    Formatter::operator()<>
              ((Formatter *)
               &chunks.
                super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"}\n");
  }
  Formatter::operator()<>
            ((Formatter *)
             &chunks.
              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             "size_t $classname$::ByteSizeLong() const {\n// @@protoc_insertion_point(message_byte_size_start:$full_name$)\n"
            );
  google::protobuf::io::Printer::Indent();
  Formatter::operator()<>
            ((Formatter *)
             &chunks.
              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"size_t total_size = 0;\n\n");
  descriptor = this->descriptor_;
  if (0 < *(int *)(descriptor + 0x7c)) {
    Formatter::operator()<>
              ((Formatter *)
               &chunks.
                super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "total_size += _extensions_.ByteSize();\n\n");
    descriptor = this->descriptor_;
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&vars;
  vars._M_t._M_impl._0_4_ = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  options = &this->options_;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  SetUnknkownFieldsVariable
            (descriptor,options,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1d8);
  Formatter::AddMap((Formatter *)
                    &chunks.
                     super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_1d8);
  if (this->num_required_fields_ < 2) {
    ppFVar15 = (this->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar4 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar15 != ppFVar4) {
      pFVar12 = &pMStack_38->field_generators_;
      ppvVar2 = &chunks.
                 super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      do {
        pFVar18 = *ppFVar15;
        if (*(int *)(pFVar18 + 0x3c) == 2) {
          PrintFieldComment<google::protobuf::FieldDescriptor>((Formatter *)ppvVar2,pFVar18);
          FieldName_abi_cxx11_((string *)local_178,(cpp *)pFVar18,field_00);
          Formatter::operator()
                    ((Formatter *)ppvVar2,"if (_internal_has_$1$()) {\n",(string *)local_178);
          if (local_178 != (undefined1  [8])&cold_skipper.has_bit_indices_) {
            operator_delete((void *)local_178);
          }
          google::protobuf::io::Printer::Indent();
          pFVar13 = FieldGeneratorMap::get(pFVar12,pFVar18);
          (*pFVar13->_vptr_FieldGenerator[0x14])(pFVar13,printer);
          google::protobuf::io::Printer::Outdent();
          Formatter::operator()<>((Formatter *)ppvVar2,"}\n");
        }
        ppFVar15 = ppFVar15 + 1;
      } while (ppFVar15 != ppFVar4);
    }
  }
  else {
    RequiredFieldsBitMask
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&chunk_mask_str.field_2 + 8),this);
    has_bits_var.length_ = in_R9;
    has_bits_var.ptr_ = (char *)0xa;
    (anonymous_namespace)::ConditionalToCheckBitmasks_abi_cxx11_
              ((string *)local_178,(void *)((long)&chunk_mask_str.field_2 + 8),
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1,true,has_bits_var);
    Formatter::operator()
              ((Formatter *)
               &chunks.
                super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "if ($1$) {  // All required fields are present.\n",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
    if (local_178 != (undefined1  [8])&cold_skipper.has_bit_indices_) {
      operator_delete((void *)local_178);
    }
    google::protobuf::io::Printer::Indent();
    ppFVar15 = (this->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar4 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar15 != ppFVar4) {
      pFVar12 = &pMStack_38->field_generators_;
      ppvVar2 = &chunks.
                 super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      do {
        pFVar18 = *ppFVar15;
        if (*(int *)(pFVar18 + 0x3c) == 2) {
          PrintFieldComment<google::protobuf::FieldDescriptor>((Formatter *)ppvVar2,pFVar18);
          pFVar13 = FieldGeneratorMap::get(pFVar12,pFVar18);
          (*pFVar13->_vptr_FieldGenerator[0x14])(pFVar13,printer);
          Formatter::operator()<>((Formatter *)ppvVar2,"\n");
        }
        ppFVar15 = ppFVar15 + 1;
      } while (ppFVar15 != ppFVar4);
    }
    google::protobuf::io::Printer::Outdent();
    Formatter::operator()<>
              ((Formatter *)
               &chunks.
                super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "} else {\n  total_size += RequiredFieldsByteSizeFallback();\n}\n");
    if (chunk_mask_str.field_2._8_8_ != 0) {
      operator_delete((void *)chunk_mask_str.field_2._8_8_);
    }
  }
  ppFVar15 = (pMStack_38->optimized_order_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppFVar4 = (pMStack_38->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  auStack_a8 = (undefined1  [8])0x0;
  chunks.
  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  chunks.
  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __position_00._M_current =
       chunks.
       super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pMVar5 = pMStack_38;
  for (; chunks.
         super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start = __position_00._M_current, pMStack_38 = pMVar5,
      ppFVar15 != ppFVar4; ppFVar15 = ppFVar15 + 1) {
    pFVar18 = *ppFVar15;
    local_178 = (undefined1  [8])pFVar18;
    if ((auStack_a8 == (undefined1  [8])__position_00._M_current) ||
       (field = __position_00._M_current[-1].
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1],
       *(int *)(field + 0x3c) != *(int *)(pFVar18 + 0x3c))) {
LAB_001e2f2a:
      if (__position_00._M_current ==
          chunks.
          super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ::_M_realloc_insert<>
                  ((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                    *)auStack_a8,__position_00);
        __position_00._M_current =
             chunks.
             super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        ((__position_00._M_current)->
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ((__position_00._M_current)->
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ((__position_00._M_current)->
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        chunks.
        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             chunks.
             super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
        __position_00._M_current =
             chunks.
             super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
    }
    else {
      iVar8 = HasByteIndex(pMVar5,field);
      iVar9 = HasByteIndex(pMVar5,pFVar18);
      if (iVar8 != iVar9) goto LAB_001e2f2a;
    }
    __position._M_current =
         __position_00._M_current[-1].
         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        __position_00._M_current[-1].
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)(__position_00._M_current + -1),__position,(FieldDescriptor **)local_178);
    }
    else {
      *__position._M_current = (FieldDescriptor *)local_178;
      pppFVar1 = &__position_00._M_current[-1].
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppFVar1 = *pppFVar1 + 1;
    }
    __position_00._M_current =
         chunks.
         super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pMVar5 = pMStack_38;
  }
  lVar19 = (long)__position_00._M_current - (long)auStack_a8;
  cached_has_word_index_00 = (int *)0xaaaaaaaaaaaaaaab;
  lVar22 = (lVar19 >> 3) * -0x5555555555555555 >> 2;
  pvVar16 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)auStack_a8;
  lVar23 = lVar19;
  if (0 < lVar22) {
    pvVar16 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)((long)auStack_a8 + lVar22 * 4 * 0x18);
    lVar22 = lVar22 + 1;
    __first._M_current =
         (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *)((long)auStack_a8 + 0x30);
    do {
      if (*(int *)(*__first._M_current[-2].
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x3c) == 2) {
        __first._M_current = __first._M_current + -2;
        goto LAB_001e30aa;
      }
      if (*(int *)(*__first._M_current[-1].
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x3c) == 2) {
        __first._M_current = __first._M_current + -1;
        goto LAB_001e30aa;
      }
      if (*(int *)(*((__first._M_current)->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start + 0x3c) == 2) goto LAB_001e30aa;
      if (*(int *)(*__first._M_current[1].
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x3c) == 2) {
        __first._M_current = __first._M_current + 1;
        goto LAB_001e30aa;
      }
      lVar22 = lVar22 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar22);
    lVar23 = (long)__position_00._M_current - (long)pvVar16;
  }
  lVar23 = (lVar23 >> 3) * -0x5555555555555555;
  if (lVar23 == 1) {
LAB_001e3087:
    __first._M_current = pvVar16;
    if (*(int *)(*(pvVar16->
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start + 0x3c) != 2) {
      __first._M_current = __position_00._M_current;
    }
LAB_001e30aa:
    pvVar16 = __first._M_current + 1;
    if (pvVar16 != __position_00._M_current && __first._M_current != __position_00._M_current) {
      do {
        ppFVar15 = (pvVar16->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        if (*(int *)(*ppFVar15 + 0x3c) != 2) {
          ppFVar4 = ((__first._M_current)->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          ((__first._M_current)->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_start = ppFVar15;
          ppFVar15 = (pvVar16->
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     )._M_impl.super__Vector_impl_data._M_end_of_storage;
          ((__first._M_current)->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_finish =
               (pvVar16->
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          ((__first._M_current)->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage = ppFVar15;
          (pvVar16->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pvVar16->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pvVar16->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (ppFVar4 != (pointer)0x0) {
            operator_delete(ppFVar4);
          }
          __first._M_current = __first._M_current + 1;
        }
        pvVar16 = pvVar16 + 1;
      } while (pvVar16 != __position_00._M_current);
      lVar19 = (long)chunks.
                     super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8;
    }
  }
  else {
    if (lVar23 == 2) {
LAB_001e3077:
      __first._M_current = pvVar16;
      if (*(int *)(*(pvVar16->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start + 0x3c) != 2) {
        pvVar16 = pvVar16 + 1;
        goto LAB_001e3087;
      }
      goto LAB_001e30aa;
    }
    __first._M_current = __position_00._M_current;
    if (lVar23 == 3) {
      __first._M_current = pvVar16;
      if (*(int *)(*(pvVar16->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start + 0x3c) != 2) {
        pvVar16 = pvVar16 + 1;
        goto LAB_001e3077;
      }
      goto LAB_001e30aa;
    }
  }
  std::
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ::_M_erase((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              *)auStack_a8,__first,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)((long)&(((_Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           *)auStack_a8)->_M_impl).super__Vector_impl_data._M_start + lVar19));
  has_bit_indices = &pMStack_38->has_bit_indices_;
  anon_unknown_0::ColdChunkSkipper::ColdChunkSkipper
            ((ColdChunkSkipper *)local_178,options,
             (vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              *)auStack_a8,has_bit_indices,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  local_3c = -1;
  Formatter::operator()<>
            ((Formatter *)
             &chunks.
              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             "$uint32$ cached_has_bits = 0;\n// Prevent compiler warnings about cached_has_bits being unused\n(void) cached_has_bits;\n\n"
            );
  if ((undefined1  [8])
      chunks.
      super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != auStack_a8) {
    pFVar12 = &pMStack_38->field_generators_;
    uVar26 = 0;
    do {
      auVar6 = auStack_a8;
      psVar24 = &chunk_mask_str._M_string_length;
      ppFVar15 = (((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)((long)auStack_a8 + uVar26 * 0x18))->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           *)((long)auStack_a8 + uVar26 * 0x18))->
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar15) < 9) {
        format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
      }
      else {
        iVar8 = HasWordIndex(pMStack_38,*ppFVar15);
        format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             CONCAT31((int3)((uint)iVar8 >> 8),iVar8 != -1);
      }
      local_100 = (undefined1  [8])psVar24;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"");
      chunk_mask_str.field_2._8_8_ = printer;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&masks_for_has_bits,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&cold_skipper.cold_threshold_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&masks_for_has_bits);
      if (local_100 != (undefined1  [8])psVar24) {
        operator_delete((void *)local_100);
      }
      pvVar16 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)((long)auVar6 + uVar26 * 0x18);
      if (format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ != '\0') {
        uVar10 = anon_unknown_0::GenChunkMask(pvVar16,has_bit_indices);
        this_00 = (AlphaNum *)(chunk_mask_str.field_2._M_local_buf + 8);
        HVar27.value = (ulong)uVar10;
        HVar27._8_8_ = 8;
        google::protobuf::strings::AlphaNum::AlphaNum(this_00,HVar27);
        local_100 = (undefined1  [8])psVar24;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_100,chunk_mask_str.field_2._8_8_,
                   (long)masks_for_has_bits.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start + chunk_mask_str.field_2._8_8_);
        if (uVar10 == 0) {
LAB_001e32b8:
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)this_00,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0xf10);
          pLVar14 = (LogMessage *)
                    google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)this_00,"CHECK failed: (2) <= (popcnt(chunk_mask)): ");
          google::protobuf::internal::LogFinisher::operator=
                    ((LogFinisher *)&__end4.descriptor,pLVar14);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)this_00);
        }
        else {
          iVar8 = 0;
          uVar17 = uVar10;
          do {
            iVar8 = iVar8 + (uVar17 & 1);
            bVar7 = 1 < uVar17;
            uVar17 = uVar17 >> 1;
          } while (bVar7);
          if (iVar8 < 2) goto LAB_001e32b8;
        }
        if (uVar10 != 0) {
          iVar8 = 0;
          do {
            iVar8 = iVar8 + (uVar10 & 1);
            bVar7 = 1 < uVar10;
            uVar10 = uVar10 >> 1;
          } while (bVar7);
          if (8 < iVar8) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)this_00,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0xf11);
            pLVar14 = (LogMessage *)
                      google::protobuf::internal::LogMessage::operator<<
                                ((LogMessage *)this_00,"CHECK failed: (8) >= (popcnt(chunk_mask)): "
                                );
            google::protobuf::internal::LogFinisher::operator=
                      ((LogFinisher *)&__end4.descriptor,pLVar14);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)this_00);
          }
        }
        iVar8 = local_3c;
        iVar9 = HasWordIndex(pMStack_38,
                             *(pvVar16->
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              )._M_impl.super__Vector_impl_data._M_start);
        if (iVar8 != iVar9) {
          local_3c = iVar9;
          Formatter::operator()
                    ((Formatter *)
                     &chunks.
                      super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     "cached_has_bits = _has_bits_[$1$];\n",&local_3c);
        }
        Formatter::operator()
                  ((Formatter *)
                   &chunks.
                    super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   "if (cached_has_bits & 0x$1$u) {\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
        google::protobuf::io::Printer::Indent();
        if (local_100 != (undefined1  [8])psVar24) {
          operator_delete((void *)local_100);
        }
      }
      ppFVar15 = (pvVar16->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      if ((pvVar16->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_finish != ppFVar15) {
        uVar25 = 0;
        do {
          pFVar18 = ppFVar15[uVar25];
          pFVar13 = FieldGeneratorMap::get(pFVar12,pFVar18);
          PrintFieldComment<google::protobuf::FieldDescriptor>
                    ((Formatter *)
                     &chunks.
                      super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,pFVar18);
          iVar8 = *(int *)(pFVar18 + 0x3c);
          if (iVar8 == 3) {
            bVar7 = false;
          }
          else {
            if (pFVar18[0x41] == (FieldDescriptor)0x0) {
              if ((iVar8 == 1) && (*(int *)(*(long *)(pFVar18 + 0x28) + 0x3c) == 2)) {
                if (*(long *)(pFVar18 + 0x58) == 0) goto LAB_001e3410;
              }
              else if (iVar8 == 2) goto LAB_001e3410;
            }
            else {
LAB_001e3410:
              if (*(char *)(*(long *)(pFVar18 + 0x78) + 0x4f) == '\0') {
                bVar7 = true;
                anon_unknown_0::PrintPresenceCheck
                          ((Formatter *)
                           &chunks.
                            super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,pFVar18,
                           (vector<int,_std::allocator<int>_> *)
                           (has_bit_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start,(Printer *)&local_3c,
                           cached_has_word_index_00);
                goto LAB_001e34ae;
              }
            }
            chunk_mask_str.field_2._8_8_ =
                 &masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
            psVar3 = (string *)((long)&chunk_mask_str.field_2 + 8);
            std::__cxx11::string::_M_construct<char_const*>((string *)psVar3,"this->","");
            bVar7 = anon_unknown_0::EmitFieldNonDefaultCondition(printer,psVar3,pFVar18);
            if ((pointer *)chunk_mask_str.field_2._8_8_ !=
                &masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish) {
              operator_delete((void *)chunk_mask_str.field_2._8_8_);
            }
          }
LAB_001e34ae:
          (*pFVar13->_vptr_FieldGenerator[0x14])(pFVar13,printer);
          if (bVar7 != false) {
            google::protobuf::io::Printer::Outdent();
            Formatter::operator()<>
                      ((Formatter *)
                       &chunks.
                        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,"}\n\n");
          }
          if (iVar8 == 3) {
            Formatter::operator()<>
                      ((Formatter *)
                       &chunks.
                        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,"\n");
          }
          uVar25 = uVar25 + 1;
          ppFVar15 = (pvVar16->
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar25 < (ulong)((long)(pvVar16->
                                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar15
                                 >> 3));
      }
      if (format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ != '\0') {
        google::protobuf::io::Printer::Outdent();
        Formatter::operator()<>
                  ((Formatter *)
                   &chunks.
                    super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"}\n");
      }
      bVar7 = anon_unknown_0::ColdChunkSkipper::OnEndChunk
                        ((ColdChunkSkipper *)local_178,(int)uVar26,printer);
      if (bVar7) {
        local_3c = -1;
      }
      uVar26 = uVar26 + 1;
      uVar25 = ((long)chunks.
                      super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 >> 3) *
               -0x5555555555555555;
    } while (uVar26 <= uVar25 && uVar25 - uVar26 != 0);
  }
  chunk_mask_str._M_dataplus._M_p = (pointer)pMStack_38->descriptor_;
  local_100 = (undefined1  [8])((ulong)local_100 & 0xffffffff00000000);
  __end4.descriptor._0_4_ = *(undefined4 *)((Descriptor *)chunk_mask_str._M_dataplus._M_p + 0x70);
  pFVar12 = &pMStack_38->field_generators_;
  ppvVar2 = &chunks.
             super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  psVar3 = (string *)(&chunk_mask_str.field_2._M_allocated_capacity + 1);
  while (bVar7 = operator==((Iterator *)local_100,(Iterator *)&__end4.descriptor),
        pMVar5 = pMStack_38, !bVar7) {
    lVar19 = (long)(int)local_100._0_4_;
    lVar23 = *(long *)(chunk_mask_str._M_dataplus._M_p + 0x30);
    Formatter::operator()
              ((Formatter *)ppvVar2,"switch ($1$_case()) {\n",
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (lVar23 + lVar19 * 0x30));
    google::protobuf::io::Printer::Indent();
    plVar21 = (long *)(lVar23 + lVar19 * 0x30);
    cold_skipper.limit_chunk_ = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = (undefined4)plVar21[3];
    __end4._0_8_ = plVar21;
    while (bVar7 = operator==((Iterator *)&cold_skipper.limit_chunk_,
                              (Iterator *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count),
          !bVar7) {
      pFVar18 = *(FieldDescriptor **)(plVar21[4] + (long)cold_skipper.limit_chunk_ * 8);
      PrintFieldComment<google::protobuf::FieldDescriptor>((Formatter *)ppvVar2,pFVar18);
      UnderscoresToCamelCase(psVar3,*(string **)pFVar18,true);
      Formatter::operator()((Formatter *)ppvVar2,"case k$1$: {\n",psVar3);
      if ((pointer *)chunk_mask_str.field_2._8_8_ !=
          &masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish) {
        operator_delete((void *)chunk_mask_str.field_2._8_8_);
      }
      google::protobuf::io::Printer::Indent();
      pFVar13 = FieldGeneratorMap::get(pFVar12,pFVar18);
      (*pFVar13->_vptr_FieldGenerator[0x14])(pFVar13,printer);
      Formatter::operator()<>((Formatter *)ppvVar2,"break;\n");
      google::protobuf::io::Printer::Outdent();
      Formatter::operator()<>((Formatter *)ppvVar2,"}\n");
      cold_skipper.limit_chunk_ = cold_skipper.limit_chunk_ + 1;
    }
    chunk_mask_str.field_2._8_8_ =
         &masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_finish;
    lVar23 = *(long *)*plVar21;
    std::__cxx11::string::_M_construct<char*>
              ((string *)psVar3,lVar23,((long *)*plVar21)[1] + lVar23);
    if (masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      puVar20 = (pointer)0x0;
      do {
        if ((byte)(*(char *)(chunk_mask_str.field_2._8_8_ + (long)puVar20) + 0x9fU) < 0x1a) {
          *(char *)(chunk_mask_str.field_2._8_8_ + (long)puVar20) =
               *(char *)(chunk_mask_str.field_2._8_8_ + (long)puVar20) + -0x20;
        }
        puVar20 = (pointer)((long)puVar20 + 1);
      } while (masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start != puVar20);
    }
    Formatter::operator()((Formatter *)ppvVar2,"case $1$_NOT_SET: {\n  break;\n}\n",psVar3);
    if ((pointer *)chunk_mask_str.field_2._8_8_ !=
        &masks_for_has_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish) {
      operator_delete((void *)chunk_mask_str.field_2._8_8_);
    }
    google::protobuf::io::Printer::Outdent();
    Formatter::operator()<>((Formatter *)ppvVar2,"}\n");
    local_100._0_4_ = local_100._0_4_ + 1;
  }
  if (pMStack_38->num_weak_fields_ != 0) {
    Formatter::operator()<>
              ((Formatter *)
               &chunks.
                super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "total_size += _weak_field_map_.ByteSizeLong();\n");
  }
  Formatter::operator()<>
            ((Formatter *)
             &chunks.
              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             "if (PROTOBUF_PREDICT_FALSE($have_unknown_fields$)) {\n");
  FVar11 = GetOptimizeFor(*(FileDescriptor **)(pMVar5->descriptor_ + 0x10),options,(bool *)0x0);
  format_00 = 
  "  return ::$proto_ns$::internal::ComputeUnknownFieldsSize(\n      _internal_metadata_, total_size, &_cached_size_);\n"
  ;
  if (FVar11 == FileOptions_OptimizeMode_LITE_RUNTIME) {
    format_00 = "  total_size += $unknown_fields$.size();\n";
  }
  Formatter::operator()<>
            ((Formatter *)
             &chunks.
              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,format_00);
  Formatter::operator()<>
            ((Formatter *)
             &chunks.
              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"}\n");
  Formatter::operator()<>
            ((Formatter *)
             &chunks.
              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             "int cached_size = ::$proto_ns$::internal::ToCachedSize(total_size);\nSetCachedSize(cached_size);\nreturn total_size;\n"
            );
  google::protobuf::io::Printer::Outdent();
  Formatter::operator()<>
            ((Formatter *)
             &chunks.
              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"}\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&cold_skipper.cold_threshold_);
  std::
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ::~vector((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             *)auStack_a8);
  this_02 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_1d8;
LAB_001e38a6:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(this_02);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&format);
  return;
}

Assistant:

void MessageGenerator::GenerateByteSize(io::Printer* printer) {
  Formatter format(printer, variables_);

  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    std::map<std::string, std::string> vars;
    SetUnknkownFieldsVariable(descriptor_, options_, &vars);
    format.AddMap(vars);
    format(
        "size_t $classname$::ByteSizeLong() const {\n"
        "// @@protoc_insertion_point(message_set_byte_size_start:$full_name$)\n"
        "  size_t total_size = _extensions_.MessageSetByteSize();\n"
        "  if ($have_unknown_fields$) {\n"
        "    total_size += ::$proto_ns$::internal::\n"
        "        ComputeUnknownMessageSetItemsSize($unknown_fields$);\n"
        "  }\n"
        "  int cached_size = "
        "::$proto_ns$::internal::ToCachedSize(total_size);\n"
        "  SetCachedSize(cached_size);\n"
        "  return total_size;\n"
        "}\n");
    return;
  }

  if (num_required_fields_ > 1) {
    // Emit a function (rarely used, we hope) that handles the required fields
    // by checking for each one individually.
    format(
        "size_t $classname$::RequiredFieldsByteSizeFallback() const {\n"
        "// @@protoc_insertion_point(required_fields_byte_size_fallback_start:"
        "$full_name$)\n");
    format.Indent();
    format("size_t total_size = 0;\n");
    for (auto field : optimized_order_) {
      if (field->is_required()) {
        format(
            "\n"
            "if (_internal_has_$1$()) {\n",
            FieldName(field));
        format.Indent();
        PrintFieldComment(format, field);
        field_generators_.get(field).GenerateByteSize(printer);
        format.Outdent();
        format("}\n");
      }
    }
    format(
        "\n"
        "return total_size;\n");
    format.Outdent();
    format("}\n");
  }

  format(
      "size_t $classname$::ByteSizeLong() const {\n"
      "// @@protoc_insertion_point(message_byte_size_start:$full_name$)\n");
  format.Indent();
  format(
      "size_t total_size = 0;\n"
      "\n");

  if (descriptor_->extension_range_count() > 0) {
    format(
        "total_size += _extensions_.ByteSize();\n"
        "\n");
  }

  std::map<std::string, std::string> vars;
  SetUnknkownFieldsVariable(descriptor_, options_, &vars);
  format.AddMap(vars);

  // Handle required fields (if any).  We expect all of them to be
  // present, so emit one conditional that checks for that.  If they are all
  // present then the fast path executes; otherwise the slow path executes.
  if (num_required_fields_ > 1) {
    // The fast path works if all required fields are present.
    const std::vector<uint32> masks_for_has_bits = RequiredFieldsBitMask();
    format("if ($1$) {  // All required fields are present.\n",
           ConditionalToCheckBitmasks(masks_for_has_bits));
    format.Indent();
    // Oneof fields cannot be required, so optimized_order_ contains all of the
    // fields that we need to potentially emit.
    for (auto field : optimized_order_) {
      if (!field->is_required()) continue;
      PrintFieldComment(format, field);
      field_generators_.get(field).GenerateByteSize(printer);
      format("\n");
    }
    format.Outdent();
    format(
        "} else {\n"  // the slow path
        "  total_size += RequiredFieldsByteSizeFallback();\n"
        "}\n");
  } else {
    // num_required_fields_ <= 1: no need to be tricky
    for (auto field : optimized_order_) {
      if (!field->is_required()) continue;
      PrintFieldComment(format, field);
      format("if (_internal_has_$1$()) {\n", FieldName(field));
      format.Indent();
      field_generators_.get(field).GenerateByteSize(printer);
      format.Outdent();
      format("}\n");
    }
  }

  std::vector<std::vector<const FieldDescriptor*>> chunks = CollectFields(
      optimized_order_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        return a->label() == b->label() && HasByteIndex(a) == HasByteIndex(b);
      });

  // Remove chunks with required fields.
  chunks.erase(std::remove_if(chunks.begin(), chunks.end(), IsRequired),
               chunks.end());

  ColdChunkSkipper cold_skipper(options_, chunks, has_bit_indices_, kColdRatio);
  int cached_has_word_index = -1;

  format(
      "$uint32$ cached_has_bits = 0;\n"
      "// Prevent compiler warnings about cached_has_bits being unused\n"
      "(void) cached_has_bits;\n\n");

  for (int chunk_index = 0; chunk_index < chunks.size(); chunk_index++) {
    const std::vector<const FieldDescriptor*>& chunk = chunks[chunk_index];
    const bool have_outer_if =
        chunk.size() > 1 && HasWordIndex(chunk[0]) != kNoHasbit;
    cold_skipper.OnStartChunk(chunk_index, cached_has_word_index, "", printer);

    if (have_outer_if) {
      // Emit an if() that will let us skip the whole chunk if none are set.
      uint32 chunk_mask = GenChunkMask(chunk, has_bit_indices_);
      std::string chunk_mask_str =
          StrCat(strings::Hex(chunk_mask, strings::ZERO_PAD_8));

      // Check (up to) 8 has_bits at a time if we have more than one field in
      // this chunk.  Due to field layout ordering, we may check
      // _has_bits_[last_chunk * 8 / 32] multiple times.
      GOOGLE_DCHECK_LE(2, popcnt(chunk_mask));
      GOOGLE_DCHECK_GE(8, popcnt(chunk_mask));

      if (cached_has_word_index != HasWordIndex(chunk.front())) {
        cached_has_word_index = HasWordIndex(chunk.front());
        format("cached_has_bits = _has_bits_[$1$];\n", cached_has_word_index);
      }
      format("if (cached_has_bits & 0x$1$u) {\n", chunk_mask_str);
      format.Indent();
    }

    // Go back and emit checks for each of the fields we processed.
    for (int j = 0; j < chunk.size(); j++) {
      const FieldDescriptor* field = chunk[j];
      const FieldGenerator& generator = field_generators_.get(field);
      bool have_enclosing_if = false;
      bool need_extra_newline = false;

      PrintFieldComment(format, field);

      if (field->is_repeated()) {
        // No presence check is required.
        need_extra_newline = true;
      } else if (HasHasbit(field)) {
        PrintPresenceCheck(format, field, has_bit_indices_, printer,
                           &cached_has_word_index);
        have_enclosing_if = true;
      } else {
        // Without field presence: field is serialized only if it has a
        // non-default value.
        have_enclosing_if =
            EmitFieldNonDefaultCondition(printer, "this->", field);
      }

      generator.GenerateByteSize(printer);

      if (have_enclosing_if) {
        format.Outdent();
        format(
            "}\n"
            "\n");
      }
      if (need_extra_newline) {
        format("\n");
      }
    }

    if (have_outer_if) {
      format.Outdent();
      format("}\n");
    }

    if (cold_skipper.OnEndChunk(chunk_index, printer)) {
      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }

  // Fields inside a oneof don't use _has_bits_ so we count them in a separate
  // pass.
  for (auto oneof : OneOfRange(descriptor_)) {
    format("switch ($1$_case()) {\n", oneof->name());
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      PrintFieldComment(format, field);
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      if (IsFieldUsed(field, options_)) {
        field_generators_.get(field).GenerateByteSize(printer);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        ToUpper(oneof->name()));
    format.Outdent();
    format("}\n");
  }

  if (num_weak_fields_) {
    // TagSize + MessageSize
    format("total_size += _weak_field_map_.ByteSizeLong();\n");
  }

  format("if (PROTOBUF_PREDICT_FALSE($have_unknown_fields$)) {\n");
  if (UseUnknownFieldSet(descriptor_->file(), options_)) {
    // We go out of our way to put the computation of the uncommon path of
    // unknown fields in tail position. This allows for better code generation
    // of this function for simple protos.
    format(
        "  return ::$proto_ns$::internal::ComputeUnknownFieldsSize(\n"
        "      _internal_metadata_, total_size, &_cached_size_);\n");
  } else {
    format("  total_size += $unknown_fields$.size();\n");
  }
  format("}\n");

  // We update _cached_size_ even though this is a const method.  Because
  // const methods might be called concurrently this needs to be atomic
  // operations or the program is undefined.  In practice, since any concurrent
  // writes will be writing the exact same value, normal writes will work on
  // all common processors. We use a dedicated wrapper class to abstract away
  // the underlying atomic. This makes it easier on platforms where even relaxed
  // memory order might have perf impact to replace it with ordinary loads and
  // stores.
  format(
      "int cached_size = ::$proto_ns$::internal::ToCachedSize(total_size);\n"
      "SetCachedSize(cached_size);\n"
      "return total_size;\n");

  format.Outdent();
  format("}\n");
}